

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int dump_active_event_fn(event_base *base,event *e,void *arg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *gloss;
  FILE *output;
  void *arg_local;
  event *e_local;
  event_base *base_local;
  
  pcVar1 = "fd ";
  if ((e->ev_events & 8U) != 0) {
    pcVar1 = "sig";
  }
  if (((e->ev_evcallback).evcb_flags & 0x28U) != 0) {
    pcVar6 = "";
    if ((e->ev_res & 2U) != 0) {
      pcVar6 = " Read";
    }
    pcVar8 = "";
    if ((e->ev_res & 4U) != 0) {
      pcVar8 = " Write";
    }
    pcVar7 = "";
    if ((e->ev_res & 0x80U) != 0) {
      pcVar7 = " EOF";
    }
    pcVar3 = "";
    if ((e->ev_res & 8U) != 0) {
      pcVar3 = " Signal";
    }
    pcVar5 = "";
    if ((e->ev_res & 1U) != 0) {
      pcVar5 = " Timeout";
    }
    pcVar4 = "";
    if (((e->ev_evcallback).evcb_flags & 0x10U) != 0) {
      pcVar4 = " [Internal]";
    }
    pcVar2 = "";
    if (((e->ev_evcallback).evcb_flags & 0x20U) != 0) {
      pcVar2 = " [NextTime]";
    }
    fprintf((FILE *)arg,"  %p [%s %d, priority=%d]%s%s%s%s%s active%s%s\n",e,pcVar1,
            (ulong)(uint)e->ev_fd,(ulong)(e->ev_evcallback).evcb_pri,pcVar6,pcVar8,pcVar7,pcVar3,
            pcVar5,pcVar4,pcVar2);
  }
  return 0;
}

Assistant:

static int
dump_active_event_fn(const struct event_base *base, const struct event *e, void *arg)
{
	FILE *output = arg;
	const char *gloss = (e->ev_events & EV_SIGNAL) ?
	    "sig" : "fd ";

	if (! (e->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)))
		return 0;

	fprintf(output, "  %p [%s "EV_SOCK_FMT", priority=%d]%s%s%s%s%s active%s%s\n",
	    (void*)e, gloss, EV_SOCK_ARG(e->ev_fd), e->ev_pri,
	    (e->ev_res&EV_READ)?" Read":"",
	    (e->ev_res&EV_WRITE)?" Write":"",
	    (e->ev_res&EV_CLOSED)?" EOF":"",
	    (e->ev_res&EV_SIGNAL)?" Signal":"",
	    (e->ev_res&EV_TIMEOUT)?" Timeout":"",
	    (e->ev_flags&EVLIST_INTERNAL)?" [Internal]":"",
	    (e->ev_flags&EVLIST_ACTIVE_LATER)?" [NextTime]":"");

	return 0;
}